

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O0

void state_align_search_fill_iter(ps_seg_t *seg)

{
  ps_alignment_entry_t *ppVar1;
  char *local_28;
  ps_alignment_entry_t *entry;
  state_align_seg_t *itor;
  ps_seg_t *seg_local;
  
  ppVar1 = ps_alignment_iter_get((ps_alignment_iter_t *)seg[1].vt);
  seg->sf = ppVar1->start;
  seg->ef = ppVar1->start + ppVar1->duration + -1;
  seg->ascr = ppVar1->score;
  seg->lscr = 0;
  if ((ppVar1->id).wid < 0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = seg->search->dict->word[(ppVar1->id).wid].word;
  }
  seg->text = local_28;
  seg->wid = (ppVar1->id).wid;
  return;
}

Assistant:

static void
state_align_search_fill_iter(ps_seg_t *seg)
{
    state_align_seg_t *itor = (state_align_seg_t *)seg;
    ps_alignment_entry_t *entry = ps_alignment_iter_get(itor->itor);

    seg->sf = entry->start;
    seg->ef = entry->start + entry->duration - 1;
    seg->ascr = entry->score;
    seg->lscr = 0;
    seg->text = dict_wordstr(ps_search_dict(seg->search), entry->id.wid);
    seg->wid = entry->id.wid;
}